

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O1

pcp_server_state_e handle_server_ping(pcp_server_t *s)

{
  __suseconds_t _Var1;
  pcp_flow_state_e pVar2;
  pcp_flow_t *f;
  pcp_server_t *local_40;
  pcp_flow_t *local_38;
  
  s->ping_count = 0;
  while( true ) {
    if (s == (pcp_server_t *)0x0) {
      f = (pcp_flow_t *)0x0;
    }
    else {
      local_38 = (pcp_flow_t *)0x0;
      local_40 = s;
      pcp_db_foreach_flow(s->ctx,get_first_flow_iter,&local_40);
      s->ping_flow_msg = local_38;
      f = local_38;
    }
    if (f == (pcp_flow_t *)0x0) break;
    f->retry_count = 0;
    pcp_logger(PCP_LOGLVL_INFO,"Pinging PCP server at address %s",s->pcp_server_paddr);
    pVar2 = handle_flow_event(f,fev_send,(pcp_recv_msg_t *)0x0);
    if (pVar2 != pfs_failed) {
      _Var1 = (f->timeout).tv_usec;
      (s->next_timeout).tv_sec = (f->timeout).tv_sec;
      (s->next_timeout).tv_usec = _Var1;
      return pss_wait_ping_resp;
    }
  }
  (s->next_timeout).tv_sec = 0;
  (s->next_timeout).tv_usec = 0;
  return pss_ping;
}

Assistant:

static pcp_server_state_e handle_server_ping(pcp_server_t *s) {
    pcp_flow_t *msg = NULL;
    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);
    s->ping_count = 0;

    while ((msg = get_ping_msg(s)) != NULL) {
        msg->retry_count = 0;

        PCP_LOG(PCP_LOGLVL_INFO, "Pinging PCP server at address %s",
                s->pcp_server_paddr);

        if (handle_flow_event(msg, fev_send, NULL) != pfs_failed) {
            s->next_timeout = msg->timeout;

            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return pss_wait_ping_resp;
        }
    }
    s->next_timeout.tv_sec = 0;
    s->next_timeout.tv_usec = 0;
    return pss_ping;
}